

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_cdef(lua_State *L)

{
  int errcode_00;
  undefined1 local_a8 [4];
  int errcode;
  CPState cp;
  GCstr *s;
  lua_State *L_local;
  CTState *cts;
  
  cp._120_8_ = lj_lib_checkstr(L,1);
  cp.L = *(lua_State **)((L->glref).ptr64 + 0x180);
  ((cp.L)->glref).ptr64 = (uint64_t)L;
  cp.param = (TValue *)(cp._120_8_ + 0x18);
  cp.ct = (CType *)(cp._120_8_ + 0x18);
  cp.cts = (CTState *)(L->base + 1);
  cp.depth = 5;
  cp.sb.L.ptr64 = (uint64_t)L;
  errcode_00 = lj_cparse((CPState *)local_a8);
  if (errcode_00 != 0) {
    lj_err_throw(L,errcode_00);
  }
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return 0;
}

Assistant:

LJLIB_CF(ffi_cdef)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  CPState cp;
  int errcode;
  cp.L = L;
  cp.cts = ctype_cts(L);
  cp.srcname = strdata(s);
  cp.p = strdata(s);
  cp.param = L->base+1;
  cp.mode = CPARSE_MODE_MULTI|CPARSE_MODE_DIRECT;
  errcode = lj_cparse(&cp);
  if (errcode) lj_err_throw(L, errcode);  /* Propagate errors. */
  lj_gc_check(L);
  return 0;
}